

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resbund.cpp
# Opt level: O3

ResourceBundle * __thiscall
icu_63::ResourceBundle::get
          (ResourceBundle *__return_storage_ptr__,ResourceBundle *this,char *key,UErrorCode *status)

{
  UResourceBundle r;
  UResourceBundle local_f0;
  
  ures_initStackObject_63(&local_f0);
  ures_getByKey_63(this->fResource,key,&local_f0,status);
  ResourceBundle(__return_storage_ptr__,&local_f0,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    ures_close_63(&local_f0);
  }
  return __return_storage_ptr__;
}

Assistant:

ResourceBundle ResourceBundle::get(const char* key, UErrorCode& status) const {
    UResourceBundle r;

    ures_initStackObject(&r);
    ures_getByKey(fResource, key, &r, &status);
    ResourceBundle res(&r, status);
    if (U_SUCCESS(status)) {
        ures_close(&r);
    }
    return res;
}